

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RelationsAnalyzer.cpp
# Opt level: O2

vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> * __thiscall
dg::vr::RelationsAnalyzer::getLoopChangeLocations
          (vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
           *__return_storage_ptr__,RelationsAnalyzer *this,VRLocation *join,
          VectorSet<const_llvm::Value_*> *froms)

{
  pointer ppVVar1;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *pvVar2;
  bool bVar3;
  vector<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_> *pvVar4;
  VRLocation *pVVar5;
  pointer ppVVar6;
  pointer ppIVar7;
  V from;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> changeLocations;
  VRLocation *local_78;
  vector<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> *local_70;
  _Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_> local_68;
  pointer local_48;
  VectorSet<const_llvm::Value_*> *local_40;
  VRLocation *local_38;
  
  local_70 = __return_storage_ptr__;
  local_40 = froms;
  local_78 = VRLocation::getTreePredecessor(join);
  local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
  _M_range_initialize<dg::vr::VRLocation_const*const*>
            ((vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>> *)
             &local_68,&local_78);
  pvVar4 = StructureAnalyzer::getInloopValues(*(StructureAnalyzer **)(this + 0x40),join);
  ppIVar7 = (pvVar4->
            super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_48 = (pvVar4->
             super__Vector_base<const_llvm::Instruction_*,_std::allocator<const_llvm::Instruction_*>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  do {
    if (ppIVar7 == local_48) {
      (local_70->
      super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
      _M_impl.super__Vector_impl_data._M_start = local_68._M_impl.super__Vector_impl_data._M_start;
      (local_70->
      super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
      _M_impl.super__Vector_impl_data._M_finish = local_68._M_impl.super__Vector_impl_data._M_finish
      ;
      (local_70->
      super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>).
      _M_impl.super__Vector_impl_data._M_end_of_storage =
           local_68._M_impl.super__Vector_impl_data._M_end_of_storage;
      local_68._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      local_68._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
LAB_001341ac:
      pvVar2 = local_70;
      std::_Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>::
      ~_Vector_base(&local_68);
      return pvVar2;
    }
    pVVar5 = VRCodeGraph::getVRLocation(*(VRCodeGraph **)(this + 0x38),*ppIVar7);
    pVVar5 = *(VRLocation **)
              ((long)(((pVVar5->successors).
                       super__Vector_base<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>,_std::allocator<std::unique_ptr<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>_>_>
                       ._M_impl.super__Vector_impl_data._M_start)->_M_t).
                     super___uniq_ptr_impl<dg::vr::VREdge,_std::default_delete<dg::vr::VREdge>_>.
                     _M_t + 8);
    ppVVar1 = (local_40->vec).
              super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
    for (ppVVar6 = (local_40->vec).
                   super__Vector_base<const_llvm::Value_*,_std::allocator<const_llvm::Value_*>_>.
                   _M_impl.super__Vector_impl_data._M_start; ppVVar6 != ppVVar1;
        ppVVar6 = ppVVar6 + 1) {
      local_78 = (VRLocation *)*ppVVar6;
      bVar3 = mayOverwrite(this,*ppIVar7,(V)local_78);
      if (bVar3) {
        bVar3 = ValueRelations::hasLoad<llvm::Value_const*>(&pVVar5->relations,(Value **)&local_78);
        if (!bVar3) {
          (local_70->
          super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
          (local_70->
          super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
          (local_70->
          super__Vector_base<const_dg::vr::VRLocation_*,_std::allocator<const_dg::vr::VRLocation_*>_>
          )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
          goto LAB_001341ac;
        }
        local_38 = pVVar5;
        std::vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>>::
        emplace_back<dg::vr::VRLocation*>
                  ((vector<dg::vr::VRLocation_const*,std::allocator<dg::vr::VRLocation_const*>> *)
                   &local_68,&local_38);
      }
    }
    ppIVar7 = ppIVar7 + 1;
  } while( true );
}

Assistant:

std::vector<const VRLocation *>
RelationsAnalyzer::getLoopChangeLocations(const VRLocation &join,
                                          const VectorSet<V> &froms) const {
    std::vector<const VRLocation *> changeLocations = {
            &join.getTreePredecessor()};

    for (const auto &inloopInst : structure.getInloopValues(join)) {
        VRLocation &targetLoc =
                *codeGraph.getVRLocation(inloopInst).getSuccLocation(0);

        for (V from : froms) {
            if (mayOverwrite(inloopInst, from)) {
                if (!targetLoc.relations.hasLoad(from))
                    return {}; // no merge by load can happen here

                changeLocations.emplace_back(&targetLoc);
            }
        }
    }
    return changeLocations;
}